

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
          (EpsCopyOutputStream *this,uint32_t num,string_view s,uint8_t *ptr)

{
  byte *pbVar1;
  size_type sVar2;
  LogMessage *pLVar3;
  const_pointer data;
  uint8_t *puVar4;
  uint32_t size;
  uint8_t *ptr_local;
  uint32_t num_local;
  EpsCopyOutputStream *this_local;
  string_view s_local;
  byte *local_68;
  uint local_60;
  LogMessage local_48;
  Voidify local_31;
  byte *local_30;
  undefined4 local_28;
  uint32_t local_24;
  EpsCopyOutputStream *local_20;
  byte *local_18;
  uint local_c;
  
  s_local._M_len = (size_t)s._M_str;
  this_local = (EpsCopyOutputStream *)s._M_len;
  pbVar1 = EnsureSpace(this,ptr);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  local_28 = 2;
  local_30 = pbVar1;
  local_24 = num;
  local_20 = this;
  if (pbVar1 < this->end_) {
    local_18 = pbVar1;
    for (local_c = num << 3 | 2; 0x7f < local_c; local_c = local_c >> 7) {
      *local_18 = (byte)local_c | 0x80;
      local_18 = local_18 + 1;
    }
    s_local._M_str = (char *)(local_18 + 1);
    *local_18 = (byte)local_c;
    local_68 = (byte *)s_local._M_str;
    for (local_60 = (uint)sVar2; 0x7f < local_60; local_60 = local_60 >> 7) {
      *local_68 = (byte)local_60 | 0x80;
      local_68 = local_68 + 1;
    }
    *local_68 = (byte)local_60;
    local_18 = (byte *)s_local._M_str;
    data = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    puVar4 = WriteRaw(this,data,(uint)sVar2,local_68 + 1);
    return puVar4;
  }
  s_local._M_str = (char *)pbVar1;
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
             ,0x355,"ptr < end_");
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_48);
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteStringOutline(uint32_t num,
                                                 absl::string_view s,
                                                 uint8_t* ptr) {
  ptr = EnsureSpace(ptr);
  uint32_t size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRaw(s.data(), size, ptr);
}